

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

int back_to_cmap(level *lev,xchar x,xchar y)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000011;
  int iVar6;
  int (*paiVar7) [5];
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  long lVar11;
  int (*paiVar12) [6];
  bool bVar13;
  
  iVar8 = (int)CONCAT71(in_register_00000031,x);
  iVar5 = (int)CONCAT71(in_register_00000011,y);
  bVar1 = lev->locations[iVar8][iVar5].typ;
  if (0x26 < bVar1) {
    pcVar10 = "back_to_cmap:  unknown location type [ = %d ]";
LAB_0016848c:
    impossible(pcVar10);
    return 0xf;
  }
  switch(bVar1) {
  case 0:
  case 0x10:
    bVar2 = (lev->flags).field_0xa & 0x10;
    iVar6 = 0x1e;
LAB_00168349:
    if (bVar2 == 0) {
      iVar6 = 1;
    }
    break;
  default:
    bVar2 = lev->locations[iVar8][iVar5].seenv;
    uVar9 = (uint)bVar2;
    if (bVar2 == 0) {
      return 1;
    }
    if (0xe < bVar1 - 1) {
switchD_0016830c_caseD_c:
      pcVar10 = "wall_angle: unexpected wall type %d";
      goto LAB_00168821;
    }
    uVar3 = (uint)bVar2;
    switch((uint)bVar1) {
    case 1:
      goto switchD_0016830c_caseD_1;
    case 2:
switchD_0016830c_caseD_2:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 3;
      }
      if (uVar9 == 2) {
        bVar13 = (bVar2 & 0x8f) != 0;
LAB_001687f1:
        return (uint)bVar13 * 2 + 1;
      }
      if (uVar9 == 1) {
        bVar13 = 7 < bVar2;
        goto LAB_001687f1;
      }
      pcVar10 = "wall_angle: unknown hwall mode %d";
      goto LAB_00168821;
    case 3:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 4;
      }
      if (uVar9 == 2) {
        bVar2 = bVar2 & 0xef;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "tlcorn";
          goto LAB_00168939;
        }
        bVar2 = bVar2 & 0x38;
      }
      return (uint)(bVar2 != 0) * 3 + 1;
    case 4:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 5;
      }
      if (uVar9 == 2) {
        bVar13 = (bVar2 & 0xbf) != 0;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "trcorn";
          goto LAB_00168939;
        }
        bVar13 = 0x1f < bVar2;
      }
      return (uint)bVar13 * 4 + 1;
    case 5:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 6;
      }
      if (uVar9 == 2) {
        bVar2 = bVar2 & 0xfb;
      }
      else {
        if (uVar9 != 1) {
          pcVar10 = "blcorn";
          goto LAB_00168939;
        }
        bVar2 = bVar2 & 0xe;
      }
      return (uint)(bVar2 != 0) * 5 + 1;
    case 6:
      uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
      if (uVar9 == 0) {
        return 7;
      }
      if (uVar9 == 2) {
        if (uVar3 == 1) {
          return 1;
        }
        return 7;
      }
      if (uVar9 != 1) {
        pcVar10 = "brcorn";
LAB_00168939:
        impossible("wall_angle: unknown %s mode %d",pcVar10);
        return 1;
      }
      bVar2 = bVar2 & 0x83;
      iVar6 = 7;
      goto LAB_00168349;
    case 7:
      switch(*(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7) {
      case 0:
        if (bVar2 < 0x10) {
          if (uVar3 == 1) {
            return 7;
          }
          if (uVar3 == 4) {
            return 6;
          }
        }
        else {
          if (uVar3 == 0x10) {
            return 4;
          }
          if (uVar3 == 0x40) {
            return 5;
          }
        }
        if ((bVar2 < 8) && (uVar3 == 5 || (char)((uVar3 & 2) >> 1) != '\0')) {
          return 9;
        }
        if (((bVar2 & 0xe3) == 0) && (uVar3 == 0x14 || (char)((uVar3 & 8) >> 3) != '\0')) {
          return 0xc;
        }
        if (((bVar2 & 0x8f) == 0) && (uVar3 == 0x50 || (char)((uVar3 & 0x20) >> 5) != '\0')) {
          return 10;
        }
        if (((bVar2 & 0x3e) == 0) && (uVar3 == 0x41 || (char)bVar2 < '\0')) {
          return 0xb;
        }
        return 8;
      case 1:
        uVar9 = (bVar2 & 0xf) << 4 | (uint)(bVar2 >> 4);
        paiVar12 = (int (*) [6])0x2a2758;
        break;
      case 2:
        uVar9 = (uint)(bVar2 >> 6) + (uVar3 & 0x3f) * 4;
        paiVar12 = (int (*) [6])0x2a2770;
        break;
      case 3:
        uVar9 = (bVar2 & 3) << 6 | (uint)(bVar2 >> 2);
        paiVar12 = cross_matrix;
        break;
      case 4:
        paiVar12 = (int (*) [6])0x2a2788;
        break;
      case 5:
        if ((bVar2 & 0xe) != 0 && (bVar2 & 0xf1) == 0) {
          return 6;
        }
        if (0x1f < bVar2 && (bVar2 & 0x1f) == 0) {
          return 5;
        }
        iVar5 = 1;
        if ((bVar2 & 0xee) != 0) {
          iVar5 = 8;
        }
        bVar2 = bVar2 & 0x11;
        goto LAB_00168a54;
      case 6:
        if ((bVar2 & 0x83) != 0 && (bVar2 & 0x7c) == 0) {
          return 7;
        }
        if ((bVar2 & 0x38) != 0 && (bVar2 & 199) == 0) {
          return 4;
        }
        iVar5 = 1;
        if ((bVar2 & 0xbb) != 0) {
          iVar5 = 8;
        }
        bVar2 = bVar2 & 0x44;
LAB_00168a54:
        if (bVar2 == 0) {
          return 8;
        }
        return iVar5;
      case 7:
        impossible("wall_angle: unknown crosswall mode");
        return 1;
      }
      if (uVar9 != 0x10) {
        uVar4 = 1;
        if ((uVar9 & 0xffffffef) != 1) {
          if ((uVar9 & 0xc) == 0) {
            if ((uVar9 & 0x60) == 0) {
              if ((uVar9 & 2) == 0) {
                uVar4 = 3;
                if (-1 < (char)uVar9) {
                  impossible("wall_angle: bottom of crwall check");
                  uVar4 = 5;
                }
              }
              else {
                uVar4 = (ulong)(-1 < (char)uVar9) ^ 5;
              }
            }
            else {
              uVar4 = 5;
              if ((uVar9 & 2) == 0) {
                uVar4 = (ulong)((uVar9 & 0x81) != 0) * 3;
              }
            }
          }
          else {
            uVar4 = 5;
            if ((uVar9 & 0xe0) == 0) {
              uVar4 = (ulong)((uVar9 & 3) != 0) * 2 + 2;
            }
          }
        }
        return (*paiVar12)[uVar4];
      }
      return 1;
    case 8:
      uVar9 = (bVar2 & 0xf) << 4 | (uint)(bVar2 >> 4);
      paiVar7 = (int (*) [5])0x2a2718;
      break;
    case 9:
      paiVar7 = wall_matrix;
      break;
    case 10:
      uVar9 = (bVar2 & 3) << 6 | (uint)(bVar2 >> 2);
      paiVar7 = (int (*) [5])0x2a2704;
      break;
    case 0xb:
      uVar9 = (uint)(bVar2 >> 6) + (uVar3 & 0x3f) * 4;
      paiVar7 = (int (*) [5])0x2a272c;
      break;
    default:
      goto switchD_0016830c_caseD_c;
    case 0xf:
      if ((lev->locations[iVar8][iVar5].field_0x7 & 2) != 0) goto switchD_0016830c_caseD_2;
      goto switchD_0016830c_caseD_1;
    }
    switch(*(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7) {
    case 0:
      if (uVar9 == 0x10) {
        lVar11 = 1;
      }
      else if (uVar9 == 0x40) {
        lVar11 = 2;
      }
      else {
        lVar11 = 4;
        if ((uVar9 & 0x50) != 0x50 && (uVar9 & 0xa8) == 0) {
          if ((uVar9 & 7) == 0) goto LAB_00168a59;
          lVar11 = 4 - (ulong)((uVar9 & 0x50) == 0);
        }
      }
      break;
    case 1:
      lVar11 = 1;
      if (((uVar9 & 0x18) == 0 || (uVar9 & 0xe0) != 0) &&
         (lVar11 = 2, (uVar9 & 0xc0) == 0 || (uVar9 & 0x38) != 0)) {
        lVar11 = 4;
        if (((uVar9 & 0x20) == 0) && ((uVar9 & 0x18) == 0 || (uVar9 & 0xc0) == 0)) {
          if ((uVar9 & 7) == 0 || (uVar9 & 0xd8) != 0) {
LAB_00168a59:
            t_warn(lev->locations[iVar8] + iVar5);
          }
          lVar11 = 0;
        }
      }
      break;
    case 2:
      lVar11 = 1;
      if (((uVar9 & 0x30) == 0 || (uVar9 & 0xcf) != 0) &&
         (lVar11 = 3, (uVar9 & 0x87) == 0 || (uVar9 & 0x38) != 0)) {
        bVar13 = uVar9 == 0x40;
LAB_00168741:
        lVar11 = (ulong)!bVar13 << 2;
      }
      break;
    case 3:
      lVar11 = 2;
      if (((uVar9 & 0x60) == 0 || (uVar9 & 0x9f) != 0) &&
         (lVar11 = 3, (uVar9 & 0xf) == 0 || (uVar9 & 0xe0) != 0)) {
        bVar13 = uVar9 == 0x10;
        goto LAB_00168741;
      }
      break;
    default:
      lVar11 = 0;
      impossible("wall_angle: unknown T wall mode %d");
    }
    iVar6 = (*paiVar7)[lVar11];
    break;
  case 0xc:
    bVar13 = (lev->locations[iVar8][iVar5].field_0x7 & 2) == 0;
    iVar6 = 0x2f;
    goto LAB_001687e2;
  case 0xd:
    iVar6 = 0x1e;
    break;
  case 0xe:
    iVar6 = 0x1f;
    break;
  case 0x11:
  case 0x12:
LAB_00168a65:
    return 0x11;
  case 0x13:
    iVar6 = 0x14;
    break;
  case 0x14:
    uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6;
    switch((uVar9 >> 4 & 0x1c) >> 2) {
    case 0:
      goto LAB_00168a65;
    case 1:
      goto switchD_001682db_caseD_15;
    case 2:
      goto switchD_001682db_caseD_22;
    case 3:
      return ((uVar9 >> 0xb & 1) == 0 && (viz_array[iVar5][iVar8] & 2U) == 0) + 0xf;
    case 4:
      goto switchD_001682db_caseD_23;
    default:
      pcVar10 = "Strange db-under: %d";
      goto LAB_0016848c;
    }
  case 0x15:
switchD_001682db_caseD_15:
    iVar6 = 0x17;
    break;
  case 0x16:
    iVar6 = 0x1d;
    break;
  case 0x17:
    uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6;
    iVar6 = 0x18;
    if ((char)((uVar9 & 0x10) >> 4) == '\0' && (uVar9 & 0x1f0) != 0) {
      if ((uVar9 & 0x20) == 0) {
        iVar6 = ((uVar9 >> 9 & 1) != 0) + 0x1b;
      }
      else {
        iVar6 = ((uVar9 >> 9 & 1) != 0) + 0x19;
      }
    }
    break;
  case 0x18:
    iVar6 = ((lev->locations[iVar8][iVar5].field_0x7 & 8) != 0 || flags.lit_corridor != '\0') + 0xd;
    break;
  case 0x19:
    iVar6 = 0xf;
    if ((viz_array[iVar5][iVar8] & 2U) == 0) {
      iVar6 = ((lev->locations[iVar8][iVar5].field_0x7 & 8) == 0) + 0xf;
    }
    break;
  case 0x1a:
    if (((lev->sstairs).sx == x) && ((lev->sstairs).sy == y)) {
      bVar13 = (lev->locations[iVar8][iVar5].field_0x6 & 0x20) == 0;
      iVar6 = 0x25;
    }
    else {
      bVar13 = (lev->locations[iVar8][iVar5].field_0x6 & 0x20) == 0;
      iVar6 = 0x21;
    }
    goto LAB_001687e2;
  case 0x1b:
    bVar13 = (lev->locations[iVar8][iVar5].field_0x6 & 0x20) == 0;
    iVar6 = 0x23;
    goto LAB_001687e2;
  case 0x1c:
    iVar6 = 0x2b;
    break;
  case 0x1d:
    iVar6 = 0x28;
    break;
  case 0x1e:
    iVar6 = 0x29;
    break;
  case 0x1f:
    iVar6 = 0x2a;
    break;
  case 0x20:
    iVar6 = 0x27;
    break;
  case 0x21:
    iVar6 = 0x26;
    break;
  case 0x22:
switchD_001682db_caseD_22:
    iVar6 = 0x15;
    break;
  case 0x23:
switchD_001682db_caseD_23:
    iVar6 = 0x16;
    break;
  case 0x24:
    bVar13 = (lev->locations[iVar8][iVar5].field_0x7 & 2) == 0;
    iVar6 = 0x2d;
LAB_001687e2:
    iVar6 = iVar6 - (uint)bVar13;
    break;
  case 0x25:
    iVar6 = 0x12;
    break;
  case 0x26:
    iVar6 = 0x13;
  }
  return iVar6;
switchD_0016830c_caseD_1:
  uVar9 = *(uint *)&lev->locations[iVar8][iVar5].field_0x6 >> 4 & 7;
  if (uVar9 == 0) {
    return 2;
  }
  if (uVar9 == 2) {
    uVar3 = uVar3 & 0xffffffe3;
  }
  else {
    if (uVar9 != 1) {
      pcVar10 = "wall_angle: unknown vwall mode %d";
LAB_00168821:
      impossible(pcVar10);
      return 1;
    }
    uVar3 = uVar3 & 0x3e;
  }
  bVar13 = uVar3 == 0;
  iVar6 = 2;
  goto LAB_001687e2;
}

Assistant:

int back_to_cmap(struct level *lev, xchar x, xchar y)
{
    int idx;
    struct rm *ptr = &(lev->locations[x][y]);

    switch (ptr->typ) {
	case SCORR:
	case STONE:
	    idx = lev->flags.arboreal ? S_tree : S_stone;
	    break;
	case ROOM:
	    idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room;
	    break;
	case CORR:
	    idx = (ptr->waslit || flags.lit_corridor) ? S_litcorr : S_corr;
	    break;
	case HWALL:
	case VWALL:
	case TLCORNER:
	case TRCORNER:
	case BLCORNER:
	case BRCORNER:
	case CROSSWALL:
	case TUWALL:
	case TDWALL:
	case TLWALL:
	case TRWALL:
	case SDOOR:
	    idx = ptr->seenv ? wall_angle(ptr) : S_stone;
	    break;
	case DOOR:
	    if (ptr->doormask) {
		if (ptr->doormask & D_BROKEN)
		    idx = S_ndoor;
		else if (ptr->doormask & D_ISOPEN)
		    idx = (ptr->horizontal) ? S_hodoor : S_vodoor;
		else			/* else is closed */
		    idx = (ptr->horizontal) ? S_hcdoor : S_vcdoor;
	    } else
		idx = S_ndoor;
	    break;
	case IRONBARS:		idx = S_bars;     break;
	case TREE:		idx = S_tree;     break;
	case DEADTREE:		idx = S_deadtree; break;
	case POOL:
	case MOAT:		idx = S_pool;	  break;
	case STAIRS:
            if (lev->sstairs.sx == x && lev->sstairs.sy == y)
                idx = (ptr->ladder & LA_DOWN) ? S_dnsstair : S_upsstair;
            else
                idx = (ptr->ladder & LA_DOWN) ? S_dnstair : S_upstair;
	    break;
	case LADDER:
	    idx = (ptr->ladder & LA_DOWN) ? S_dnladder : S_upladder;
	    break;
	case FOUNTAIN:		idx = S_fountain; break;
	case SINK:		idx = S_sink;     break;
	case ALTAR:		idx = S_altar;    break;
	case GRAVE:		idx = S_grave;    break;
	case THRONE:		idx = S_throne;   break;
	case MAGIC_CHEST:	idx = S_magic_chest; break;
	case LAVAPOOL:		idx = S_lava;	  break;
	case ICE:		idx = S_ice;      break;
	case AIR:		idx = S_air;	  break;
	case CLOUD:		idx = S_cloud;	  break;
	case WATER:		idx = S_water;	  break;
	case BOG:		idx = S_bog;	  break;
	case DBWALL:
	    idx = (ptr->horizontal) ? S_hcdbridge : S_vcdbridge;
	    break;
	case DRAWBRIDGE_UP:
	    switch(ptr->drawbridgemask & DB_UNDER) {
	    case DB_MOAT:  idx = S_pool; break;
	    case DB_LAVA:  idx = S_lava; break;
	    case DB_ICE:   idx = S_ice;  break;
	    case DB_FLOOR: idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room; break;
	    case DB_BOG:   idx = S_bog;  break;
	    default:
		impossible("Strange db-under: %d",
			   ptr->drawbridgemask & DB_UNDER);
		idx = S_room; /* something is better than nothing */
		break;
	    }
	    break;
	case DRAWBRIDGE_DOWN:
	    idx = (ptr->horizontal) ? S_hodbridge : S_vodbridge;
	    break;
	default:
	    impossible("back_to_cmap:  unknown location type [ = %d ]", ptr->typ);
	    idx = S_room;
	    break;
    }

    return idx;
}